

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# diffie-hellman.c
# Opt level: O0

dh_ctx * dh_setup_group(ssh_kex *kex)

{
  byte *pbVar1;
  dh_ctx *ctx_00;
  dh_ctx *ctx;
  dh_extra *extra;
  ssh_kex *kex_local;
  
  pbVar1 = (byte *)kex->extra;
  if ((*pbVar1 & 1) == 0) {
    ctx_00 = (dh_ctx *)safemalloc(1,0x28,0);
    (**(code **)(pbVar1 + 8))(ctx_00);
    dh_init(ctx_00);
    return ctx_00;
  }
  __assert_fail("!extra->gex",
                "/workspace/llm4binary/github/license_c_cmakelists/codexns[P]putty/crypto/diffie-hellman.c"
                ,0xb3,"dh_ctx *dh_setup_group(const ssh_kex *)");
}

Assistant:

dh_ctx *dh_setup_group(const ssh_kex *kex)
{
    const struct dh_extra *extra = (const struct dh_extra *)kex->extra;
    assert(!extra->gex);
    dh_ctx *ctx = snew(dh_ctx);
    extra->construct(ctx);
    dh_init(ctx);
    return ctx;
}